

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gls::BindRelinkAttributeTest::iterate(BindRelinkAttributeTest *this)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  local_378;
  allocator<char> local_359;
  string local_358;
  Bind local_338;
  allocator<char> local_309;
  string local_308;
  Bind local_2e8;
  allocator<char> local_2b9;
  string local_2b8;
  Bind local_298;
  Cond local_270;
  allocator<char> local_241;
  string local_240;
  Attribute local_220;
  Cond local_1a0;
  allocator<char> local_171;
  string local_170;
  Attribute local_150;
  undefined1 local_d0 [8];
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  postLinkBindings;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  preLinkBindings;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  AttribType vec4;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  BindRelinkAttributeTest *this_local;
  
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::vector((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
            *)&vec4.m_locationSize);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"vec4",&local_71);
  AttributeLocationTestUtil::AttribType::AttribType((AttribType *)local_50,&local_70,1,0x8b52);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
            *)&preLinkBindings.
               super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::vector((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
            *)&postLinkBindings.
               super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::vector((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
            *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"a_0",&local_171);
  AttributeLocationTestUtil::Cond::Cond(&local_1a0,COND_ALWAYS);
  AttributeLocationTestUtil::Attribute::Attribute
            (&local_150,(AttribType *)local_50,&local_170,-1,&local_1a0,-1);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::push_back((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               *)&preLinkBindings.
                  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_150);
  AttributeLocationTestUtil::Attribute::~Attribute(&local_150);
  AttributeLocationTestUtil::Cond::~Cond(&local_1a0);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"a_1",&local_241);
  AttributeLocationTestUtil::Cond::Cond(&local_270,COND_ALWAYS);
  AttributeLocationTestUtil::Attribute::Attribute
            (&local_220,(AttribType *)local_50,&local_240,-1,&local_270,-1);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::push_back((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               *)&preLinkBindings.
                  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_220);
  AttributeLocationTestUtil::Attribute::~Attribute(&local_220);
  AttributeLocationTestUtil::Cond::~Cond(&local_270);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"a_0",&local_2b9);
  AttributeLocationTestUtil::Bind::Bind(&local_298,&local_2b8,3);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::push_back((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *)&postLinkBindings.
                  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_298);
  AttributeLocationTestUtil::Bind::~Bind(&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"a_0",&local_309);
  AttributeLocationTestUtil::Bind::Bind(&local_2e8,&local_308,5);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::push_back((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *)&postLinkBindings.
                  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2e8);
  AttributeLocationTestUtil::Bind::~Bind(&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"a_0",&local_359);
  AttributeLocationTestUtil::Bind::Bind(&local_338,&local_358,6);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::push_back((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *)local_d0,&local_338);
  AttributeLocationTestUtil::Bind::~Bind(&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  testCtx = (this->super_TestCase).super_TestNode.m_testCtx;
  renderCtx = this->m_renderCtx;
  local_378.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::vector(&local_378);
  AttributeLocationTestUtil::runTest
            (testCtx,renderCtx,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)&preLinkBindings.
                 super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
              *)&vec4.m_locationSize,
             (vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
              *)&postLinkBindings.
                 super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
              *)local_d0,true,false,&local_378);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&local_378);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
             *)local_d0);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
             *)&postLinkBindings.
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)&preLinkBindings.
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  AttributeLocationTestUtil::AttribType::~AttribType((AttribType *)local_50);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
             *)&vec4.m_locationSize);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult BindRelinkAttributeTest::iterate (void)
{
	const vector<Bind>	noBindings;
	const AttribType	vec4("vec4", 1, GL_FLOAT_VEC4);

	vector<Attribute>	attributes;
	vector<Bind>		preLinkBindings;
	vector<Bind>		postLinkBindings;

	attributes.push_back(Attribute(vec4, "a_0"));
	attributes.push_back(Attribute(vec4, "a_1"));

	preLinkBindings.push_back(Bind("a_0", 3));
	preLinkBindings.push_back(Bind("a_0", 5));

	postLinkBindings.push_back(Bind("a_0", 6));

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, preLinkBindings, postLinkBindings, true);
	return STOP;
}